

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void xdgSurfaceHandleConfigure(void *userData,xdg_surface *surface,uint32_t serial)

{
  GLFWbool GVar1;
  xdg_surface *in_RDI;
  float targetRatio;
  float aspectRatio;
  int height;
  int width;
  _GLFWwindow *window;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  float in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  uint32_t in_stack_ffffffffffffffdc;
  
  xdg_surface_ack_configure(in_RDI,in_stack_ffffffffffffffdc);
  if ((((*(int *)(in_RDI + 0x370) != *(int *)(in_RDI + 0x3b0)) &&
       (*(undefined4 *)(in_RDI + 0x370) = *(undefined4 *)(in_RDI + 0x3b0),
       *(int *)(in_RDI + 0x370) == 0)) && (*(long *)(in_RDI + 0x50) != 0)) &&
     (*(int *)(in_RDI + 0x10) != 0)) {
    xdg_toplevel_set_minimized
              ((xdg_toplevel *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  }
  if (*(int *)(in_RDI + 0x36c) != *(int *)(in_RDI + 0x3a8)) {
    *(undefined4 *)(in_RDI + 0x36c) = *(undefined4 *)(in_RDI + 0x3a8);
    _glfwInputWindowMaximize
              ((_GLFWwindow *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc);
  }
  *(undefined4 *)(in_RDI + 0x374) = *(undefined4 *)(in_RDI + 0x3b4);
  if (((*(int *)(in_RDI + 0x36c) == 0) && (*(int *)(in_RDI + 0x374) == 0)) &&
     ((*(int *)(in_RDI + 0x78) != -1 && (*(int *)(in_RDI + 0x7c) != -1)))) {
    in_stack_ffffffffffffffd4 = (float)*(int *)(in_RDI + 0x3a0) / (float)*(int *)(in_RDI + 0x3a4);
    in_stack_ffffffffffffffd0 = (float)*(int *)(in_RDI + 0x78) / (float)*(int *)(in_RDI + 0x7c);
  }
  GVar1 = resizeWindow((_GLFWwindow *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       0,0x9ef91f);
  if ((GVar1 != 0) &&
     (_glfwInputWindowSize
                ((_GLFWwindow *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8), *(int *)(in_RDI + 0x368) != 0
     )) {
    _glfwInputWindowDamage((_GLFWwindow *)0x9ef95c);
  }
  if ((*(int *)(in_RDI + 0x368) == 0) &&
     ((*(long *)(in_RDI + 0x3c8) == 0 || (*(int *)(in_RDI + 0x3d0) != 0)))) {
    *(undefined4 *)(in_RDI + 0x368) = 1;
    _glfwInputWindowDamage((_GLFWwindow *)0x9ef9a2);
  }
  return;
}

Assistant:

static void xdgSurfaceHandleConfigure(void* userData,
                                      struct xdg_surface* surface,
                                      uint32_t serial)
{
    _GLFWwindow* window = userData;

    xdg_surface_ack_configure(surface, serial);

    if (window->wl.activated != window->wl.pending.activated)
    {
        window->wl.activated = window->wl.pending.activated;
        if (!window->wl.activated)
        {
            if (window->monitor && window->autoIconify)
                xdg_toplevel_set_minimized(window->wl.xdg.toplevel);
        }
    }

    if (window->wl.maximized != window->wl.pending.maximized)
    {
        window->wl.maximized = window->wl.pending.maximized;
        _glfwInputWindowMaximize(window, window->wl.maximized);
    }

    window->wl.fullscreen = window->wl.pending.fullscreen;

    int width  = window->wl.pending.width;
    int height = window->wl.pending.height;

    if (!window->wl.maximized && !window->wl.fullscreen)
    {
        if (window->numer != GLFW_DONT_CARE && window->denom != GLFW_DONT_CARE)
        {
            const float aspectRatio = (float) width / (float) height;
            const float targetRatio = (float) window->numer / (float) window->denom;
            if (aspectRatio < targetRatio)
                height = width / targetRatio;
            else if (aspectRatio > targetRatio)
                width = height * targetRatio;
        }
    }

    if (resizeWindow(window, width, height))
    {
        _glfwInputWindowSize(window, window->wl.width, window->wl.height);

        if (window->wl.visible)
            _glfwInputWindowDamage(window);
    }

    if (!window->wl.visible)
    {
        // Allow the window to be mapped only if it either has no XDG
        // decorations or they have already received a configure event
        if (!window->wl.xdg.decoration || window->wl.xdg.decorationMode)
        {
            window->wl.visible = GLFW_TRUE;
            _glfwInputWindowDamage(window);
        }
    }
}